

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyzer.cpp
# Opt level: O0

void __thiscall
SemanticAnalyzerRun::onEnterLiteralExpressionAstNode
          (SemanticAnalyzerRun *this,LiteralExpressionAstNode *node)

{
  element_type *peVar1;
  LiteralExpressionAstNode *node_local;
  SemanticAnalyzerRun *this_local;
  
  peVar1 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &node->token);
  if (peVar1->tokenType == IntegerLiteral) {
    peVar1 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &node->token);
    std::__cxx11::stoll(&peVar1->value,(size_t *)0x0,10);
  }
  else if (peVar1->tokenType == FloatLiteral) {
    peVar1 = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &node->token);
    std::__cxx11::stod(&peVar1->value,(size_t *)0x0);
  }
  return;
}

Assistant:

void onEnterLiteralExpressionAstNode(LiteralExpressionAstNode* node) noexcept override {
    switch (node->token->tokenType) {
      case TokenType::IntegerLiteral: {
        try {
          std::stoll(node->token->value);
          return;
        } catch (...) {
          this->reportError(node->token, "Invalid value for integer literal.");
        }
      }
      case TokenType::FloatLiteral: {
        try {
          std::stod(node->token->value);
          return;
        } catch (...) {
          this->reportError(node->token, "Invalid value for float literal.");
        }
      }
      default:
        return;
    }
  }